

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::BinaryToString_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar1;
  byte *pbVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_49;
  const_iterator cStack_48;
  uchar c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  size_t line_start;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_local;
  Decompiler *this_local;
  string *s;
  
  line_start._7_1_ = 0;
  local_20 = in;
  in_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  this_local = (Decompiler *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"\"",(allocator *)((long)&line_start + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&line_start + 6));
  this_00 = local_20;
  __range2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_20);
  cStack_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end2);
    local_49 = *pbVar2;
    if ((local_49 < 0x20) || (0x7e < local_49)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"0123456789abcdef"[(int)(uint)local_49 >> 4]);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"0123456789abcdef"[(int)(local_49 & 0xf)]);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_49);
    }
    lVar3 = std::__cxx11::string::size();
    if (this->target_exp_width < (ulong)(lVar3 - (long)__range2)) {
      if (__range2 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        std::operator+(&local_70,"  ",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"\n  ");
      __range2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::__cxx11::string::size();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryToString(const std::vector<uint8_t> &in) {
    std::string s = "\"";
    size_t line_start = 0;
    static const char s_hexdigits[] = "0123456789abcdef";
    for (auto c : in) {
      if (c >= ' ' && c <= '~') {
        s += c;
      } else {
        s += '\\';
        s += s_hexdigits[c >> 4];
        s += s_hexdigits[c & 0xf];
      }
      if (s.size() - line_start > target_exp_width) {
        if (line_start == 0) {
          s = "  " + s;
        }
        s += "\"\n  ";
        line_start = s.size();
        s += "\"";
      }
    }
    s += '\"';
    return s;
  }